

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestScriptHandler.cxx
# Opt level: O2

int __thiscall
cmCTestScriptHandler::ExecuteScript(cmCTestScriptHandler *this,string *total_script_arg)

{
  cmCTest *pcVar1;
  pointer pbVar2;
  bool bVar3;
  pointer ppcVar4;
  int iVar5;
  int iVar6;
  string *psVar7;
  ostream *poVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar9;
  cmsysProcess *cp;
  char *pcVar10;
  size_t i;
  ulong uVar11;
  long lVar12;
  pointer ppcVar13;
  vector<const_char_*,_std::allocator<const_char_*>_> argv;
  char *local_398 [4];
  vector<char,_std::allocator<char>_> err;
  vector<char,_std::allocator<char>_> out;
  string line;
  ostringstream cmCTestLog_msg;
  ostringstream cmCTestLog_msg_7;
  
  argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  psVar7 = cmSystemTools::GetCTestCommand_abi_cxx11_();
  _cmCTestLog_msg = (psVar7->_M_dataplus)._M_p;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&argv,(char **)&cmCTestLog_msg);
  _cmCTestLog_msg = "-SR";
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&argv,(char **)&cmCTestLog_msg);
  _cmCTestLog_msg = (total_script_arg->_M_dataplus)._M_p;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&argv,(char **)&cmCTestLog_msg);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  poVar8 = std::operator<<((ostream *)&cmCTestLog_msg,"Executable for CTest is: ");
  psVar7 = cmSystemTools::GetCTestCommand_abi_cxx11_();
  poVar8 = std::operator<<(poVar8,(string *)psVar7);
  std::operator<<(poVar8,"\n");
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar1,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestScriptHandler.cxx"
               ,0x91,_cmCTestLog_msg_7,false);
  std::__cxx11::string::~string((string *)&cmCTestLog_msg_7);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  pvVar9 = cmCTest::GetInitialCommandLineArguments_abi_cxx11_
                     ((this->super_cmCTestGenericHandler).CTest);
  lVar12 = 0x20;
  for (uVar11 = 1;
      pbVar2 = (pvVar9->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
      uVar11 < (ulong)((long)(pvVar9->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5);
      uVar11 = uVar11 + 1) {
    _cmCTestLog_msg = *(char **)((long)&(pbVar2->_M_dataplus)._M_p + lVar12);
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&argv,(char **)&cmCTestLog_msg);
    lVar12 = lVar12 + 0x20;
  }
  _cmCTestLog_msg = (char *)0x0;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&argv,(char **)&cmCTestLog_msg);
  cp = cmsysProcess_New();
  cmsysProcess_SetCommand
            (cp,argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_start);
  cmsysProcess_SetOption(cp,0,1);
  cmsysProcess_Execute(cp);
  out.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  err.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  out.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  out.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  err.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  err.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  iVar5 = cmSystemTools::WaitForLine(cp,&line,(cmDuration)0x4059000000000000,&out,&err);
  while (iVar5 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar8 = std::operator<<((ostream *)&cmCTestLog_msg,"Output: ");
    poVar8 = std::operator<<(poVar8,(string *)&line);
    std::operator<<(poVar8,"\n");
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestScriptHandler.cxx"
                 ,0xab,_cmCTestLog_msg_7,false);
    std::__cxx11::string::~string((string *)&cmCTestLog_msg_7);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    if (iVar5 == 2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
      poVar8 = std::operator<<((ostream *)&cmCTestLog_msg,(string *)&line);
      std::operator<<(poVar8,"\n");
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestScriptHandler.cxx"
                   ,0xaf,_cmCTestLog_msg_7,false);
LAB_00488cfb:
      std::__cxx11::string::~string((string *)&cmCTestLog_msg_7);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    }
    else if (iVar5 == 3) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
      poVar8 = std::operator<<((ostream *)&cmCTestLog_msg,(string *)&line);
      std::operator<<(poVar8,"\n");
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestScriptHandler.cxx"
                   ,0xad,_cmCTestLog_msg_7,false);
      goto LAB_00488cfb;
    }
    iVar5 = cmSystemTools::WaitForLine(cp,&line,(cmDuration)0x4059000000000000,&out,&err);
  }
  cmsysProcess_WaitForExit(cp,(double *)0x0);
  iVar6 = cmsysProcess_GetState(cp);
  iVar5 = 0;
  bVar3 = false;
  switch(iVar6) {
  case 1:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar8 = std::operator<<((ostream *)&cmCTestLog_msg,"\tError executing ctest: ");
    pcVar10 = cmsysProcess_GetErrorString(cp);
    poVar8 = std::operator<<(poVar8,pcVar10);
    std::endl<char,std::char_traits<char>>(poVar8);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    iVar5 = 0;
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestScriptHandler.cxx"
                 ,0xca,_cmCTestLog_msg_7,false);
    break;
  case 2:
    iVar5 = cmsysProcess_GetExitException(cp);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar8 = std::operator<<((ostream *)&cmCTestLog_msg,"\tThere was an exception: ");
    pcVar10 = cmsysProcess_GetExceptionString(cp);
    poVar8 = std::operator<<(poVar8,pcVar10);
    poVar8 = std::operator<<(poVar8," ");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar5);
    std::endl<char,std::char_traits<char>>(poVar8);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestScriptHandler.cxx"
                 ,0xc1,_cmCTestLog_msg_7,false);
    break;
  default:
    goto switchD_00488d6b_caseD_3;
  case 4:
    iVar5 = cmsysProcess_GetExitValue(cp);
    bVar3 = false;
    goto switchD_00488d6b_caseD_3;
  case 5:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar8 = std::operator<<((ostream *)&cmCTestLog_msg,"\tThere was a timeout");
    std::endl<char,std::char_traits<char>>(poVar8);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    iVar5 = 0;
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestScriptHandler.cxx"
                 ,0xc5,_cmCTestLog_msg_7,false);
  }
  std::__cxx11::string::~string((string *)&cmCTestLog_msg_7);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  bVar3 = true;
switchD_00488d6b_caseD_3:
  cmsysProcess_Delete(cp);
  if (bVar3) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    std::operator<<((ostream *)&cmCTestLog_msg,"Error running command: [");
    poVar8 = (ostream *)std::ostream::operator<<(&cmCTestLog_msg,iVar6);
    std::operator<<(poVar8,"] ");
    ppcVar4 = argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppcVar13 = argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                    super__Vector_impl_data._M_start; ppcVar13 != ppcVar4; ppcVar13 = ppcVar13 + 1)
    {
      if (*ppcVar13 != (char *)0x0) {
        poVar8 = std::operator<<((ostream *)&cmCTestLog_msg,*ppcVar13);
        std::operator<<(poVar8," ");
      }
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg_7);
    std::__cxx11::stringbuf::str();
    poVar8 = std::operator<<((ostream *)&cmCTestLog_msg_7,(string *)local_398);
    poVar8 = std::operator<<(poVar8,*argv.
                                     super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
    std::endl<char,std::char_traits<char>>(poVar8);
    std::__cxx11::string::~string((string *)local_398);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestScriptHandler.cxx"
                 ,0xd8,local_398[0],false);
    std::__cxx11::string::~string((string *)local_398);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg_7);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    iVar5 = -1;
  }
  std::__cxx11::string::~string((string *)&line);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&err.super__Vector_base<char,_std::allocator<char>_>);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&out.super__Vector_base<char,_std::allocator<char>_>);
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            (&argv.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
  return iVar5;
}

Assistant:

int cmCTestScriptHandler::ExecuteScript(const std::string& total_script_arg)
{
  // execute the script passing in the arguments to the script as well as the
  // arguments from this invocation of cmake
  std::vector<const char*> argv;
  argv.push_back(cmSystemTools::GetCTestCommand().c_str());
  argv.push_back("-SR");
  argv.push_back(total_script_arg.c_str());

  cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
             "Executable for CTest is: " << cmSystemTools::GetCTestCommand()
                                         << "\n");

  // now pass through all the other arguments
  std::vector<std::string>& initArgs =
    this->CTest->GetInitialCommandLineArguments();
  //*** need to make sure this does not have the current script ***
  for (size_t i = 1; i < initArgs.size(); ++i) {
    argv.push_back(initArgs[i].c_str());
  }
  argv.push_back(nullptr);

  // Now create process object
  cmsysProcess* cp = cmsysProcess_New();
  cmsysProcess_SetCommand(cp, argv.data());
  // cmsysProcess_SetWorkingDirectory(cp, dir);
  cmsysProcess_SetOption(cp, cmsysProcess_Option_HideWindow, 1);
  // cmsysProcess_SetTimeout(cp, timeout);
  cmsysProcess_Execute(cp);

  std::vector<char> out;
  std::vector<char> err;
  std::string line;
  int pipe =
    cmSystemTools::WaitForLine(cp, line, std::chrono::seconds(100), out, err);
  while (pipe != cmsysProcess_Pipe_None) {
    cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
               "Output: " << line << "\n");
    if (pipe == cmsysProcess_Pipe_STDERR) {
      cmCTestLog(this->CTest, ERROR_MESSAGE, line << "\n");
    } else if (pipe == cmsysProcess_Pipe_STDOUT) {
      cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT, line << "\n");
    }
    pipe = cmSystemTools::WaitForLine(cp, line, std::chrono::seconds(100), out,
                                      err);
  }

  // Properly handle output of the build command
  cmsysProcess_WaitForExit(cp, nullptr);
  int result = cmsysProcess_GetState(cp);
  int retVal = 0;
  bool failed = false;
  if (result == cmsysProcess_State_Exited) {
    retVal = cmsysProcess_GetExitValue(cp);
  } else if (result == cmsysProcess_State_Exception) {
    retVal = cmsysProcess_GetExitException(cp);
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "\tThere was an exception: "
                 << cmsysProcess_GetExceptionString(cp) << " " << retVal
                 << std::endl);
    failed = true;
  } else if (result == cmsysProcess_State_Expired) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "\tThere was a timeout" << std::endl);
    failed = true;
  } else if (result == cmsysProcess_State_Error) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "\tError executing ctest: " << cmsysProcess_GetErrorString(cp)
                                           << std::endl);
    failed = true;
  }
  cmsysProcess_Delete(cp);
  if (failed) {
    std::ostringstream message;
    message << "Error running command: [";
    message << result << "] ";
    for (const char* arg : argv) {
      if (arg) {
        message << arg << " ";
      }
    }
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               message.str() << argv[0] << std::endl);
    return -1;
  }
  return retVal;
}